

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O3

void process_io_events(void)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  __fd_mask *p_Var6;
  fd_set *pfVar7;
  fd_set rfds;
  fd_set local_98;
  
  lVar2 = 0x10;
  p_Var6 = LispReadFds.__fds_bits;
  pfVar7 = &local_98;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pfVar7->fds_bits[0] = *p_Var6;
    p_Var6 = p_Var6 + 1;
    pfVar7 = (fd_set *)((long)pfVar7 + 8);
  }
  iVar1 = select(0x20,&local_98,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&SelectTimeout);
  if (0 < iVar1) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar5 = 1 << ((byte)uVar3 & 0x1f);
      if (((ulong)LispIOFds.__fds_bits[0] >> (uVar3 & 0x3f) & 1) == 0) {
        uVar5 = 0;
      }
      if (((ulong)local_98.fds_bits[0] >> (uVar3 & 0x3f) & 1) == 0) {
        uVar5 = 0;
      }
      uVar4 = uVar4 | uVar5;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x20);
    if (uVar4 != 0) {
      uVar5 = *IOINTERRUPTFLAGS_word;
      if ((uVar5 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
      }
      *(uint *)(Lisp_world + uVar5) = uVar4;
      uVar4 = *INTERRUPTSTATE_word;
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
      }
      Lisp_world[(ulong)uVar4 + 1] = Lisp_world[(ulong)uVar4 + 1] | 0x2000;
      *PENDINGINTERRUPT68k = 0x4c;
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
  }
  return;
}

Assistant:

void process_io_events(void)
{
#ifndef DOS
  fd_set rfds;
  u_int iflags;
  int i;

  memcpy(&rfds, &LispReadFds, sizeof(rfds));

  if (select(32, &rfds, NULL, NULL, &SelectTimeout) > 0) {

#ifdef MAIKO_ENABLE_ETHERNET
    if (ether_fd >= 0 && FD_ISSET(ether_fd, &rfds)) { /* Raw ethernet (NIT) I/O happened, so handle it. */
      DBPRINT(("Handling enet interrupt.\n\n"));
      check_ether();
    }
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef MAIKO_ENABLE_NETHUB
    check_ether();
#endif /* MAIKO_ENABLE_NETHUB */

#ifdef RS232
    if (RS232C_Fd >= 0 && (FD_ISSET(RS232C_Fd, &rfds) || (RS232C_remain_data && rs232c_lisp_is_ready())))
      rs232c_read();
#endif /* RS232 */

#if defined(MAIKO_HANDLE_CONSOLE_MESSAGES) && defined(LOGINT)
    if (LogFileFd >= 0 && FD_ISSET(LogFileFd, &rfds)) { /* There's info in the log file.  Tell Lisp to print it. */
      flush_pty();          /* move the msg(s) to the log file */

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->LogFileIO = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
#endif
    iflags = 0;
    for (i = 0; i < 32; i++)
        if (FD_ISSET(i, &rfds) & FD_ISSET(i, &LispIOFds)) iflags |= 1 << i;
    if (iflags) { /* There's activity on a Lisp-opened FD.  Tell Lisp. */
      u_int *flags;
      flags = (u_int *)NativeAligned4FromLAddr(*IOINTERRUPTFLAGS_word);
      *flags = iflags;

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->IOInterrupt = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
  }
/* #endif */
#endif /* DOS */
}